

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_suite.cpp
# Opt level: O0

void remove_map_string(void)

{
  bool v;
  size_type in_RCX;
  char *pcVar1;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_6e0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_6c0;
  iterator local_6b0;
  iterator local_698;
  iterator local_680;
  iterator local_668;
  double local_650;
  int local_648;
  bool local_641;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_640;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_638;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_5d8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_578;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_518;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_4b8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_458;
  undefined1 local_3f8 [24];
  variable expect;
  iterator local_3a0;
  iterator local_388;
  iterator local_370;
  iterator local_358;
  iterator local_340;
  undefined1 local_328 [8];
  iterator where;
  int local_308 [5];
  bool local_2f1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_2f0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_2e8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_288;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_228;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1c8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_168;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_108;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a8;
  undefined1 local_48 [24];
  variable data;
  
  local_2f0 = &local_2e8;
  local_2f1 = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_bool,_true>(local_2f0,(char (*) [6])"alpha",&local_2f1);
  local_2f0 = &local_288;
  local_308[0] = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_2f0,(char (*) [6])"bravo",local_308);
  local_2f0 = &local_228;
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current.current = '\0';
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._9_7_ = 0x40080000000000;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_double,_true>
            (local_2f0,(char (*) [8])"charlie",
             (double *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_2f0 = &local_1c8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[9],_true>
            (local_2f0,(char (*) [6])"delta",(char (*) [9])"hydrogen");
  local_2f0 = &local_168;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_wchar_t_(&)[7],_true>
            (local_2f0,(char (*) [5])"echo",(wchar_t (*) [7])L"helium");
  local_2f0 = &local_108;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char16_t_(&)[8],_true>
            (local_2f0,(char (*) [8])"foxtrot",(char16_t (*) [8])L"lithium");
  local_2f0 = &local_a8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char32_t_(&)[10],_true>
            (local_2f0,(char (*) [5])"golf",(char32_t (*) [10])L"beryllium");
  local_48._0_8_ = &local_2e8;
  local_48._8_8_ = 7;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_map<std::allocator<char>_> *)local_48._0_8_,init);
  local_6c0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_48;
  do {
    local_6c0 = local_6c0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_6c0);
  } while (local_6c0 != &local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_340,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_358,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::remove<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char[6]>
            ((iterator *)local_328,&local_340,&local_358,(char (*) [6])"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_340);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_370,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  v = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                ((iterator *)local_328,&local_370);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/remove_suite.cpp"
             ,0x116,"void remove_map_string()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_370);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3a0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&expect.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  pcVar1 = "hydrogen";
  std::remove<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char[9]>
            (&local_388,&local_3a0,(iterator *)&expect.storage.field_0x28,(char (*) [9])"hydrogen");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_328,&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3a0);
  local_640 = &local_638;
  local_641 = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_bool,_true>(local_640,(char (*) [6])"alpha",&local_641);
  local_640 = &local_5d8;
  local_648 = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_640,(char (*) [6])"bravo",&local_648);
  local_640 = &local_578;
  local_650 = 3.0;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_double,_true>(local_640,(char (*) [8])"charlie",&local_650);
  local_640 = &local_518;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_wchar_t_(&)[7],_true>
            (local_640,(char (*) [5])"echo",(wchar_t (*) [7])L"helium");
  local_640 = &local_4b8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char16_t_(&)[8],_true>
            (local_640,(char (*) [8])"foxtrot",(char16_t (*) [8])L"lithium");
  local_640 = &local_458;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char32_t_(&)[10],_true>
            (local_640,(char (*) [5])"golf",(char32_t (*) [10])L"beryllium");
  local_3f8._0_8_ = &local_638;
  local_3f8._8_8_ = 6;
  init_00._M_len = (size_type)pcVar1;
  init_00._M_array = (iterator)0x6;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_3f8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_3f8._0_8_,init_00);
  local_6e0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_3f8;
  do {
    local_6e0 = local_6e0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_6e0);
  } while (local_6e0 != &local_638);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_668,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_680,(iterator *)local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_698,(basic_variable<std::allocator<char>_> *)(local_3f8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_6b0,(basic_variable<std::allocator<char>_> *)(local_3f8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/remove_suite.cpp"
             ,0x124,"void remove_map_string()",&local_668,&local_680,&local_698,&local_6b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_698);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_680);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_668);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_3f8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void remove_map_string()
{
    // Remove by value but keep key order
    variable data = map::make(
        {
            { "alpha", true },
            { "bravo", 2 },
            { "charlie", 3.0 },
            { "delta", "hydrogen" },
            { "echo", L"helium" },
            { "foxtrot", u"lithium" },
            { "golf", U"beryllium" }
        });
    auto where = std::remove(data.begin(), data.end(), "delta");
    TRIAL_PROTOCOL_TEST(where == data.end());

    where = std::remove(data.begin(), data.end(), "hydrogen");
    variable expect = map::make(
        {
            { "alpha", true },
            { "bravo", 2 },
            { "charlie", 3.0 },
            { "echo", L"helium" },
            { "foxtrot", u"lithium" },
            { "golf", U"beryllium" }
        });
    TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), where,
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}